

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-cache-ttl.c
# Opt level: O1

int lws_cache_lookup(lws_cache_ttl_lru *cache,char *wildcard_key,void **pdata,size_t *psize)

{
  lws_cache_ttl_lru *plVar1;
  lws_dll2 *plVar2;
  int iVar3;
  lws_cache_ttl_lru *plVar4;
  lws_dll2 *plVar5;
  lws_dll2 *plVar6;
  uint8_t *ptr;
  lws_cache_match_t *m;
  ulong size;
  lws_dll2 *plVar7;
  uint8_t *p;
  lws_dll2_owner_t results_owner;
  char meta_key [128];
  uint8_t *local_e0;
  lws_dll2_owner_t local_d8;
  size_t *local_c0;
  char local_b8;
  char local_b7 [135];
  
  local_d8.tail = (lws_dll2 *)0x0;
  local_d8.head = (lws_dll2 *)0x0;
  local_d8._16_8_ = 0;
  local_b8 = '!';
  lws_strncpy(local_b7,wildcard_key,0x7e);
  iVar3 = (*((cache->info).ops)->get)(cache,&local_b8,pdata,psize);
  plVar1 = cache;
  if (iVar3 == 0) {
LAB_0011aef9:
    iVar3 = 0;
  }
  else {
    do {
      plVar4 = plVar1;
      plVar1 = (plVar4->info).parent;
    } while (plVar1 != (lws_cache_ttl_lru *)0x0);
    iVar3 = (*((plVar4->info).ops)->lookup)(plVar4,wildcard_key,&local_d8);
    if (iVar3 == 0) {
      if (local_d8.head == (lws_dll2 *)0x0) {
        size = 0;
        plVar7 = (lws_dll2 *)0x0;
      }
      else {
        plVar7 = (lws_dll2 *)0x0;
        size = 0;
        plVar5 = local_d8.head;
        do {
          size = (long)&(plVar5[1].owner)->head + size + 1;
          plVar2 = plVar5[1].prev;
          plVar5 = plVar5->next;
          plVar6 = plVar2;
          if ((long)plVar2 < (long)plVar7) {
            plVar6 = plVar7;
          }
          if (plVar7 == (lws_dll2 *)0x0) {
            plVar6 = plVar2;
          }
          if (plVar2 != (lws_dll2 *)0x0) {
            plVar7 = plVar6;
          }
        } while (plVar5 != (lws_dll2 *)0x0);
      }
      _lws_log(0x10,"%s: results %d, size %d\n","lws_cache_lookup",local_d8._16_8_ & 0xffffffff,
               size & 0xffffffff);
      ptr = (uint8_t *)lws_realloc((void *)0x0,size,"lws_cache_lookup");
      plVar5 = local_d8.head;
      local_e0 = ptr;
      local_c0 = psize;
      if (ptr != (uint8_t *)0x0) {
        for (; plVar5 != (lws_dll2 *)0x0; plVar5 = plVar5->next) {
          lws_ser_wu32be(local_e0,*(uint32_t *)&plVar5[1].next);
          local_e0 = local_e0 + 4;
          lws_ser_wu32be(local_e0,*(uint32_t *)&plVar5[1].owner);
          local_e0 = local_e0 + 4;
          memcpy(local_e0,plVar5 + 2,(size_t)((long)&(plVar5[1].owner)->tail + 1));
          plVar2 = plVar5 + 1;
          local_e0 = local_e0 + (long)((long)&plVar2->owner->tail + 1);
        }
        lws_cache_clear_matches(&local_d8);
        iVar3 = (*((cache->info).ops)->write)(cache,&local_b8,ptr,size,(lws_usec_t)plVar7,&local_e0)
        ;
        lws_realloc(ptr,0,"lws_free");
        if (iVar3 != 0) {
          return 1;
        }
        *pdata = local_e0;
        *local_c0 = size;
        goto LAB_0011aef9;
      }
    }
    else {
      _lws_log(0x10,"%s: bs lookup fail\n","lws_cache_lookup");
    }
    lws_cache_clear_matches(&local_d8);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
lws_cache_lookup(struct lws_cache_ttl_lru *cache, const char *wildcard_key,
		 const void **pdata, size_t *psize)
{
	struct lws_cache_ttl_lru *l1 = cache;
	lws_dll2_owner_t results_owner;
	lws_usec_t expiry = 0;
	char meta_key[128];
	uint8_t *p, *temp;
	size_t sum = 0;
	int n;

	memset(&results_owner, 0, sizeof(results_owner));
	meta_key[0] = META_ITEM_LEADING;
	lws_strncpy(&meta_key[1], wildcard_key, sizeof(meta_key) - 2);

	/*
	 * If we have a cached result set in L1 already, return that
	 */

	if (!l1->info.ops->get(l1, meta_key, pdata, psize))
		return 0;

	/*
	 * No, we have to do the actual lookup work in the backing store layer
	 * to get results for this...
	 */

	while (cache->info.parent)
		cache = cache->info.parent;

	if (cache->info.ops->lookup(cache, wildcard_key, &results_owner)) {
		/* eg, OOM */

		lwsl_cache("%s: bs lookup fail\n", __func__);

		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Scan the results, we want to know how big a payload it needs in
	 * the cache, and we want to know the earliest expiry of any of the
	 * component parts, so the meta cache entry for these results can be
	 * expired when any of the results would expire.
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);
		sum += 8; /* payload size, name length */
		sum += m->tag_size + 1;

		if (m->expiry && (!expiry || expiry < m->expiry))
			expiry = m->expiry;

	} lws_end_foreach_dll(d);

	lwsl_cache("%s: results %d, size %d\n", __func__,
		    (int)results_owner.count, (int)sum);

	temp = lws_malloc(sum, __func__);
	if (!temp) {
		lws_cache_clear_matches(&results_owner);
		return 1;
	}

	/*
	 * Fill temp with the serialized results
	 */

	p = temp;
	lws_start_foreach_dll(struct lws_dll2 *, d, results_owner.head) {
		lws_cache_match_t *m = lws_container_of(d, lws_cache_match_t,
							list);

		/* we don't copy the payload in, but take note of its size */
		lws_ser_wu32be(p, (uint32_t)m->payload_size);
		p += 4;
		/* length of the tag name (there is an uncounted NUL after) */
		lws_ser_wu32be(p, (uint32_t)m->tag_size);
		p += 4;

		/* then the tag name, plus the extra NUL */
		memcpy(p, &m[1], m->tag_size + 1);
		p += m->tag_size + 1;

	} lws_end_foreach_dll(d);

	lws_cache_clear_matches(&results_owner);

	/*
	 * Create the right amount of space for an L1 record of these results,
	 * with its expiry set to the earliest of the results, and copy it in
	 * from temp
	 */

	n = l1->info.ops->write(l1, meta_key, temp, sum, expiry, (void **)&p);
	/* done with temp */
	lws_free(temp);

	if (n)
		return 1;

	/* point to the results in L1 */

	*pdata = p;
	*psize = sum;

	return 0;
}